

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_error.cpp
# Opt level: O0

void ON_Warning(char *sFileName,int line_number,char *sFormat,...)

{
  char in_AL;
  bool bPrint;
  bool bVar1;
  char *description_00;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_1a8 [24];
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined1 local_f8 [8];
  ON_ErrorEvent error_event;
  undefined1 local_48 [8];
  va_list args;
  ON_String description;
  bool bPrintErrorMessage;
  char *sFormat_local;
  int line_number_local;
  char *sFileName_local;
  
  if (in_AL != '\0') {
    local_178 = in_XMM0_Qa;
    local_168 = in_XMM1_Qa;
    local_158 = in_XMM2_Qa;
    local_148 = in_XMM3_Qa;
    local_138 = in_XMM4_Qa;
    local_128 = in_XMM5_Qa;
    local_118 = in_XMM6_Qa;
    local_108 = in_XMM7_Qa;
  }
  local_190 = in_RCX;
  local_188 = in_R8;
  local_180 = in_R9;
  ON_IncrementWarningCount();
  bPrint = ON_Internal_PrintWarningMessage();
  if ((bPrint) || (bVar1 = ON_Internal_LogError(), bVar1)) {
    ON_String::ON_String((ON_String *)&args[0].reg_save_area);
    if ((sFormat != (char *)0x0) && (*sFormat != '\0')) {
      args[0].overflow_arg_area = local_1a8;
      args[0]._0_8_ = &stack0x00000008;
      local_48._4_4_ = 0x30;
      local_48._0_4_ = 0x18;
      ON_String::FormatVargs((ON_String *)&args[0].reg_save_area,sFormat,(__va_list_tag *)local_48);
    }
    description_00 = ON_String::operator_cast_to_char_((ON_String *)&args[0].reg_save_area);
    ON_ErrorEvent::ON_ErrorEvent
              ((ON_ErrorEvent *)local_f8,Warning,sFileName,line_number,(char *)0x0,description_00);
    ON_Internal_RecordErrorEvent((ON_ErrorEvent *)local_f8,bPrint);
    ON_String::~ON_String((ON_String *)&args[0].reg_save_area);
  }
  return;
}

Assistant:

void ON_VARGS_FUNC_CDECL ON_Warning(
  const char* sFileName,
  int line_number,
  const char* sFormat,
  ...
)
{
  ON_IncrementWarningCount();

  const bool bPrintErrorMessage = ON_Internal_PrintWarningMessage();
  if ( bPrintErrorMessage || ON_Internal_LogError())
  {
    ON_String description;
    if (sFormat && sFormat[0]) 
    {
      va_list args;
      va_start(args, sFormat);
      description.FormatVargs(sFormat, args);
      va_end(args);
    }

    const ON_ErrorEvent error_event(
      ON_ErrorEvent::Type::Warning,
      sFileName,
      (unsigned int)line_number,
      nullptr,
      description
    );

    ON_Internal_RecordErrorEvent(error_event, bPrintErrorMessage);
  }

}